

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstream.cpp
# Opt level: O1

void __thiscall sai::ifstream::ifstream(ifstream *this,path *Path)

{
  undefined1 *this_00;
  ifstreambuf *this_01;
  int __oflag;
  
  this_00 = &(this->super_istream).field_0x10;
  std::ios_base::ios_base((ios_base *)this_00);
  *(code **)&(this->super_istream).field_0x10 = std::streambuf::pbackfail;
  *(undefined8 *)&(this->super_istream).field_0xe8 = 0;
  *(undefined2 *)&(this->super_istream).field_0xf0 = 0;
  *(undefined8 *)&(this->super_istream).field_0xf8 = 0;
  *(undefined8 *)&(this->super_istream).field_0x100 = 0;
  *(undefined8 *)&(this->super_istream).field_0x108 = 0;
  *(undefined8 *)&(this->super_istream).field_0x110 = 0;
  this_01 = (ifstreambuf *)operator_new(0x1278);
  ifstreambuf::ifstreambuf(this_01,(span<const_unsigned_int,_256UL>)0x106284);
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x109cb0;
  *(undefined8 *)&(this->super_istream).field_0x10 = 0x109cd8;
  (this->super_istream)._M_gcount = 0;
  std::ios::init((streambuf *)this_00);
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x109c40;
  *(undefined8 *)&(this->super_istream).field_0x10 = 0x109c68;
  ifstreambuf::open(*(ifstreambuf **)&(this->super_istream).field_0xf8,(char *)Path,__oflag);
  return;
}

Assistant:

ifstream::ifstream(const std::filesystem::path& Path) : std::istream(new ifstreambuf())
{
	reinterpret_cast<ifstreambuf*>(rdbuf())->open(Path);
}